

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_word_wrapper.cpp
# Opt level: O0

void __thiscall
WordWrapper_LongWordShortLine_Test::~WordWrapper_LongWordShortLine_Test
          (WordWrapper_LongWordShortLine_Test *this)

{
  WordWrapper_LongWordShortLine_Test *this_local;
  
  ~WordWrapper_LongWordShortLine_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (WordWrapper, LongWordShortLine) {
    std::string const text = "antidisestablishmentarianism is along word";

    std::vector<std::string> lines;
    // Note this loop it hand-written to ensure that the test operations don't vary according to the
    // implementation of standard library functions.
    auto it = word_wrapper (text, 4);
    std::string const & s = *it;
    EXPECT_EQ (s, "antidisestablishmentarianism");
}